

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d_device.c
# Opt level: O0

int read_devices(s98context *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  s98deviceinfo *psVar5;
  s98deviceinfo info_1;
  int devices_1;
  s98deviceinfo info;
  int devices;
  int devices_allocated;
  s98context *ctx_local;
  
  if ((ctx->header).version == 1) {
    ctx->devices = &default_opna;
  }
  else {
    if ((ctx->header).version == 2) {
      info.reserved = 0;
      info.panpot = 0;
      ctx->devices = (s98deviceinfo *)0x0;
      while( true ) {
        uVar1 = read_dword(ctx);
        uVar2 = read_dword(ctx);
        uVar3 = read_dword(ctx);
        uVar4 = read_dword(ctx);
        if (uVar1 == 0) break;
        if ((int)info.reserved <= (int)(info.panpot + 1)) {
          info.reserved = info.reserved + 4;
          psVar5 = (s98deviceinfo *)realloc(ctx->devices,(long)(int)info.reserved << 4);
          ctx->devices = psVar5;
        }
        psVar5 = ctx->devices + (int)info.panpot;
        psVar5->device = uVar1;
        psVar5->clock = uVar2;
        psVar5->panpot = uVar3;
        psVar5->reserved = uVar4;
        info.panpot = info.panpot + 1;
      }
      if (info.panpot == 0) {
        ctx->devices = &default_opna;
        (ctx->header).device_count = 1;
        return 0;
      }
      psVar5 = (s98deviceinfo *)realloc(ctx->devices,(long)(int)info.panpot);
      ctx->devices = psVar5;
      (ctx->header).device_count = info.panpot;
    }
    if ((ctx->header).version == 3) {
      if ((ctx->header).device_count == 0) {
        ctx->devices = &default_opna;
        (ctx->header).device_count = 1;
      }
      else {
        psVar5 = (s98deviceinfo *)calloc((ulong)(ctx->header).device_count,0x10);
        ctx->devices = psVar5;
        for (info_1.panpot = 0; info_1.panpot < (ctx->header).device_count;
            info_1.panpot = info_1.panpot + 1) {
          uVar1 = read_dword(ctx);
          uVar2 = read_dword(ctx);
          uVar3 = read_dword(ctx);
          uVar4 = read_dword(ctx);
          psVar5 = ctx->devices + (int)info_1.panpot;
          psVar5->device = uVar1;
          psVar5->clock = uVar2;
          psVar5->panpot = uVar3;
          psVar5->reserved = uVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

int read_devices(struct s98context* ctx)
{
    if(ctx->header.version == 1) {
        ctx->devices = &default_opna;
        return 0;
    }

    if(ctx->header.version == 2) {
        int devices_allocated = 0;
        int devices = 0;

        ctx->devices = NULL;

        for(;;) {
            struct s98deviceinfo info;
            
            info.device = read_dword(ctx);
            info.clock = read_dword(ctx);
            info.panpot = read_dword(ctx);
            info.reserved = read_dword(ctx);

            if(info.device == s98NONE) break;

            if(devices + 1 >= devices_allocated)  {
                devices_allocated += 4;
                ctx->devices = realloc(ctx->devices, devices_allocated * sizeof(struct s98deviceinfo));
            }
            ctx->devices[devices] = info;
            devices++;
        }
        if(devices == 0) {
            ctx->devices = &default_opna;
            ctx->header.device_count = 1;
            return 0;
        } else {
            ctx->devices = realloc(ctx->devices, devices);
            ctx->header.device_count = devices;
        }
    }
    if(ctx->header.version == 3) {
        if(ctx->header.device_count == 0) {
            ctx->devices = &default_opna;
            ctx->header.device_count = 1;
            return 0;
        }

        int devices;

        ctx->devices = calloc(ctx->header.device_count, sizeof(struct s98deviceinfo));

        for(devices = 0; devices < ctx->header.device_count; devices++) {
            struct s98deviceinfo info;

            info.device = read_dword(ctx);
            info.clock = read_dword(ctx);
            info.panpot = read_dword(ctx);
            info.reserved = read_dword(ctx);

            ctx->devices[devices] = info;
        }
    }
    return 0;
}